

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O3

void __thiscall
SQNativeClosure::SQNativeClosure(SQNativeClosure *this,SQSharedState *ss,SQFUNCTION func)

{
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQNativeClosure_001492e8;
  (this->_typecheck)._vals = (longlong *)0x0;
  (this->_typecheck)._size = 0;
  (this->_typecheck)._allocated = 0;
  (this->_name).super_SQObject._type = OT_NULL;
  (this->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_function = func;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  this->_env = (SQWeakRef *)0x0;
  return;
}

Assistant:

SQNativeClosure(SQSharedState *ss,SQFUNCTION func){_function=func;INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this); _env = NULL;}